

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::apply
          (QGate1<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  undefined7 in_register_00000031;
  int iVar2;
  undefined4 in_register_00000084;
  anon_class_40_5_d6c92a71_conflict f;
  undefined1 local_68 [8];
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> local_60;
  anon_class_40_5_d6c92a71_conflict local_58;
  
  iVar2 = offset;
  iVar1 = (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(local_68,this);
  lambda_QGate1<std::complex<float>>
            (&local_58,(qgates *)(CONCAT71(in_register_00000031,op) & 0xffffffff),(Op)local_68,
             (SquareMatrix<std::complex<float>_> *)
             (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (complex<float> *)CONCAT44(in_register_00000084,iVar2));
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_60);
  apply2<qclab::qgates::lambda_QGate1<std::complex<float>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<float>>,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_58);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }